

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int jrtplib::GetIPv4SocketPort(SocketType s,uint16_t *pPort)

{
  in_port_t iVar1;
  int iVar2;
  int iVar3;
  int type;
  uint length;
  uint size;
  sockaddr_in addr;
  
  if (pPort != (uint16_t *)0x0) {
    addr.sin_family = 0;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
    size = 0x10;
    iVar2 = getsockname(s,(sockaddr *)&addr,&size);
    iVar3 = -0x9b;
    if ((iVar2 == 0) && (iVar3 = -0x9c, addr.sin_family == 2)) {
      iVar1 = addr.sin_port;
      if (addr.sin_port == 0) {
        iVar3 = -0x9d;
      }
      else {
        type = 0;
        length = 4;
        iVar2 = getsockopt(s,1,3,&type,&length);
        iVar3 = -0x9e;
        if ((iVar2 == 0) && (iVar3 = -0x9f, type == 2)) {
          *pPort = iVar1 << 8 | iVar1 >> 8;
          iVar3 = 0;
        }
      }
    }
    return iVar3;
  }
  __assert_fail("pPort != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fcsl[P]jrtplib-3/src/rtpudpv4transmitter.cpp"
                ,0x88,"int jrtplib::GetIPv4SocketPort(SocketType, uint16_t *)");
}

Assistant:

static int GetIPv4SocketPort(SocketType s, uint16_t *pPort)
{
	assert(pPort != 0);

	struct sockaddr_in addr;
	memset(&addr, 0, sizeof(struct sockaddr_in));

	RTPSOCKLENTYPE size = sizeof(struct sockaddr_in);
	if (getsockname(s,(struct sockaddr*)&addr,&size) != 0)
		return ERR_RTP_UDPV4TRANS_CANTGETSOCKETPORT;

	if (addr.sin_family != AF_INET)
		return ERR_RTP_UDPV4TRANS_NOTANIPV4SOCKET;

	uint16_t port = ntohs(addr.sin_port);
	if (port == 0)
		return ERR_RTP_UDPV4TRANS_SOCKETPORTNOTSET;
	
	int type = 0;
	RTPSOCKLENTYPE length = sizeof(type);

	if (getsockopt(s, SOL_SOCKET, SO_TYPE, (char*)&type, &length) != 0)
		return ERR_RTP_UDPV4TRANS_CANTGETSOCKETTYPE;

	if (type != SOCK_DGRAM)
		return ERR_RTP_UDPV4TRANS_INVALIDSOCKETTYPE;

	*pPort = port;
	return 0;
}